

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O0

void __thiscall Firework::explode(Firework *this)

{
  Rng *this_00;
  float _x;
  float _y;
  float _z;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar1;
  double dVar2;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_70;
  float local_68;
  float local_64;
  float magnitude;
  float angle;
  Particle particle;
  int i;
  vec4 color;
  Rng *rng;
  Firework *this_local;
  
  this_00 = piksel::Rng::getInstance();
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            ((vec<4,_float,_(glm::qualifier)0> *)((long)&particle.color.field_0 + 0xc),_x,_y,_z,1.0)
  ;
  for (particle.color.field_0.field_0.z = 0.0; (int)particle.color.field_0.field_0.z < 200;
      particle.color.field_0.field_0.z = (float)((int)particle.color.field_0.field_0.z + 1)) {
    Particle::Particle((Particle *)&magnitude);
    _magnitude = *(anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
                   *)&(this->rocket).position.field_0;
    piksel::Rng::random(this_00);
    piksel::Rng::random(this_00);
    local_64 = extraout_XMM0_Da;
    piksel::Rng::random(this_00);
    local_68 = extraout_XMM0_Da_00;
    dVar1 = cos((double)local_64);
    dVar2 = sin((double)local_64);
    glm::vec<2,float,(glm::qualifier)0>::vec<double,double>
              ((vec<2,float,(glm::qualifier)0> *)&local_70.field_0,
               (double)extraout_XMM0_Da_00 * dVar1,(double)local_68 * dVar2);
    particle.position.field_0 =
         (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
         (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)local_70.field_0;
    piksel::Rng::random(this_00);
    particle.acceleration.field_0.field_0.y = (float)(int)extraout_XMM0_Da_01;
    particle.lifespan = particle.color.field_0._12_4_;
    particle.mass = (float)i;
    std::vector<Particle,_std::allocator<Particle>_>::push_back
              (&this->particles,(value_type *)&magnitude);
  }
  this->exploded = true;
  return;
}

Assistant:

void Firework::explode() {
    piksel::Rng& rng = piksel::Rng::getInstance();
    glm::vec4 color = glm::vec4(rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), 1.0f);
    for (int i = 0; i < 200; i++) {
        Particle particle;
        particle.position = rocket.position;
        particle.mass = rng.random(0.7, 1.0);
        float angle = rng.random(0.0, piksel::TWO_PI);
        float magnitude = rng.random(2.0f, 10.0f);
        particle.velocity = glm::vec2(magnitude * cos(angle), magnitude * sin(angle));
        particle.lifespan = rng.random(90.0f, 110.0f);
        particle.color = color;
        particles.push_back(particle);
    }
    exploded = true;
}